

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main() {
  Director* director = new Director(new SimpleBuilder);
  Maze* maze = director->getMaze();
  assert(maze->level == 10);

  director = new Director(new ComplexBuilder);
  maze = director->getMaze();
  assert(maze->level == 100);
}